

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O0

NDSTATUS NdFetchVex2(INSTRUX *Instrux,ND_UINT8 *Code,ND_UINT8 Offset,ND_SIZET Size)

{
  ND_SIZET Size_local;
  ND_UINT8 Offset_local;
  ND_UINT8 *Code_local;
  INSTRUX *Instrux_local;
  
  if (Size < (ulong)Offset + 2) {
    return 0x80000001;
  }
  if ((((undefined1  [488])*Instrux & (undefined1  [488])0x3) == (undefined1  [488])0x2) ||
     ((Code[(int)(Offset + 1)] & 0xc0) == 0xc0)) {
    if ((((*(uint *)&Instrux->field_0x5 >> 5 & 1) != 0) ||
        ((((*(uint *)&Instrux->field_0x5 >> 8 & 1) != 0 ||
          ((*(uint *)&Instrux->field_0x5 >> 9 & 1) != 0)) ||
         ((*(uint *)&Instrux->field_0x5 & 1) != 0)))) ||
       (((*(uint *)&Instrux->field_0x5 >> 1 & 1) != 0 ||
        ((*(uint *)&Instrux->field_0x5 >> 7 & 1) != 0)))) {
      return 0x80000007;
    }
    *(uint *)Instrux = *(uint *)Instrux & 0xffcfffff;
    *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 & 0xfffffffb | 4;
    *(uint *)Instrux = *(uint *)Instrux & 0xfff0ffff | 0x20000;
    (Instrux->field_73).Rex = *(ND_REX *)(Code + Offset);
    *(ND_UINT8 *)((long)&Instrux->field_73 + 1) = Code[(int)(Offset + 1)];
    Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)((uint)Instrux->Exs & 0xffffc1ff | 0x200);
    Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                   ((uint)Instrux->Exs & 0xfffffffd |
                   ((*(byte *)((long)&Instrux->field_73 + 1) >> 7 ^ 0xffffffff) & 1) << 1);
    Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                   ((uint)Instrux->Exs & 0xfff0ffff |
                   ((*(byte *)((long)&Instrux->field_73 + 1) >> 3 & 0xf ^ 0xffffffff) & 0xf) << 0x10
                   );
    Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                   ((uint)Instrux->Exs & 0xffff3fff |
                   (uint)(*(byte *)((long)&Instrux->field_73 + 1) >> 2 & 1) << 0xe);
    Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                   ((uint)Instrux->Exs & 0xfffffe7f |
                   (uint)(*(byte *)((long)&Instrux->field_73 + 1) & 3) << 7);
    Instrux->Length = Instrux->Length + '\x02';
    if (0xf < Instrux->Length) {
      return 0x80000003;
    }
  }
  return 0;
}

Assistant:

static NDSTATUS
NdFetchVex2(
    INSTRUX *Instrux,
    const ND_UINT8 *Code,
    ND_UINT8 Offset,
    ND_SIZET Size
    )
{
    // One more byte has to follow, the modrm or the second VEX byte.
    RET_GT((ND_SIZET)Offset + 2, Size, ND_STATUS_BUFFER_TOO_SMALL);

    // VEX is available only in 32 & 64 bit mode.
    if ((ND_CODE_64 == Instrux->DefCode) || ((Code[Offset + 1] & 0xC0) == 0xC0))
    {
        // Make sure we don't have any other prefix.
        if (Instrux->HasOpSize || 
            Instrux->HasRepnzXacquireBnd ||
            Instrux->HasRepRepzXrelease || 
            Instrux->HasRex || 
            Instrux->HasRex2 || 
            Instrux->HasLock)
        {
            return ND_STATUS_VEX_WITH_PREFIX;
        }

        // Fill in VEX2 info.
        Instrux->VexMode = ND_VEXM_2B;
        Instrux->HasVex = ND_TRUE;
        Instrux->EncMode = ND_ENCM_VEX;
        Instrux->Vex2.Vex[0] = Code[Offset];
        Instrux->Vex2.Vex[1] = Code[Offset + 1];

        Instrux->Exs.m = 1; // For VEX2 instructions, always use the second table.
        Instrux->Exs.r = (ND_UINT32)~Instrux->Vex2.r;
        Instrux->Exs.v = (ND_UINT32)~Instrux->Vex2.v;
        Instrux->Exs.l = Instrux->Vex2.l;
        Instrux->Exs.p = Instrux->Vex2.p;

        // Update Instrux length & offset, and make sure we don't exceed 15 bytes.
        Instrux->Length += 2;
        if (Instrux->Length > ND_MAX_INSTRUCTION_LENGTH)
        {
            return ND_STATUS_INSTRUCTION_TOO_LONG;
        }
    }

    return ND_STATUS_SUCCESS;
}